

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_randomspawner.cpp
# Opt level: O0

void __thiscall ARandomSpawner::BeginPlay(ARandomSpawner *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  bool local_75;
  TFlags<ActorFlag4,_unsigned_int> local_74;
  TFlags<ActorFlag2,_unsigned_int> local_70;
  TFlags<ActorFlag,_unsigned_int> local_6c;
  AActor *local_68;
  AActor *defmobj;
  PClassActor *rep;
  AActor *local_50;
  PClassActor *cls;
  FName local_2c;
  bool local_25;
  int local_24;
  bool nomonsters;
  DDropItem *pDStack_20;
  int n;
  DDropItem *drop;
  DDropItem *di;
  ARandomSpawner *this_local;
  
  local_24 = 0;
  di = (DDropItem *)this;
  uVar2 = FIntCVar::operator_cast_to_int(&dmflags);
  local_75 = (uVar2 & 0x1000) != 0 || (::level.flags2 & 0x8000) != 0;
  local_25 = local_75;
  AActor::BeginPlay(&this->super_AActor);
  pDStack_20 = AActor::GetDropItems(&this->super_AActor);
  drop = pDStack_20;
  if (pDStack_20 != (DDropItem *)0x0) {
    while (drop != (DDropItem *)0x0) {
      bVar1 = FName::operator!=(&drop->Name,NAME_None);
      if (bVar1) {
        if (((local_25 & 1U) == 0) || (bVar1 = IsMonster(drop), !bVar1)) {
          if (drop->Amount < 0) {
            drop->Amount = 1;
          }
          local_24 = drop->Amount + local_24;
        }
        drop = drop->Next;
      }
    }
    if (local_24 == 0) {
      (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
    }
    else {
      drop = pDStack_20;
      local_24 = FRandom::operator()(&pr_randomspawn,local_24);
      while (-1 < local_24 && drop != (DDropItem *)0x0) {
        bVar1 = FName::operator!=(&drop->Name,NAME_None);
        if ((!bVar1) || (((local_25 & 1U) != 0 && (bVar1 = IsMonster(drop), bVar1)))) {
          drop = drop->Next;
        }
        else {
          local_24 = local_24 - drop->Amount;
          if ((drop->Next == (DDropItem *)0x0) || (local_24 < 0)) {
            local_24 = -1;
          }
          else {
            drop = drop->Next;
          }
        }
      }
      if ((drop == (DDropItem *)0x0) || (0x1f < (this->super_AActor).bouncecount)) {
        FName::FName(&local_2c,"Unknown");
        AActor::Pos((DVector3 *)&cls,&this->super_AActor);
        Spawn(&local_2c,(DVector3 *)&cls,NO_REPLACE);
        (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
      }
      else {
        iVar3 = FRandom::operator()(&pr_randomspawn);
        if (iVar3 <= drop->Probability) {
          FName::FName((FName *)((long)&rep + 4),&drop->Name);
          local_50 = (AActor *)PClass::FindActor((FName *)((long)&rep + 4));
          if ((local_50 != (AActor *)0x0) &&
             (defmobj = (AActor *)PClassActor::GetReplacement((PClassActor *)local_50,true),
             defmobj != (AActor *)0x0)) {
            local_50 = defmobj;
          }
          if (local_50 == (AActor *)0x0) {
            FName::GetChars(&drop->Name);
            Printf("\x1cGUnknown item class %s to drop from a random spawner\n");
            FNameNoInit::operator=(&(this->super_AActor).Species,NAME_None);
          }
          else {
            FNameNoInit::operator=
                      (&(this->super_AActor).Species,(FName *)&local_50->VisibleEndPitch);
            local_68 = GetDefaultByType((PClass *)local_50);
            (this->super_AActor).Speed = local_68->Speed;
            TFlags<ActorFlag,_unsigned_int>::operator&
                      (&local_6c,
                       (int)local_68 +
                       (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                       MF_SHOOTABLE));
            TFlags<ActorFlag,_unsigned_int>::operator|=(&(this->super_AActor).flags,&local_6c);
            TFlags<ActorFlag2,_unsigned_int>::operator&
                      (&local_70,(int)local_68 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
            TFlags<ActorFlag2,_unsigned_int>::operator|=(&(this->super_AActor).flags2,&local_70);
            TFlags<ActorFlag4,_unsigned_int>::operator&
                      (&local_74,
                       (int)local_68 +
                       (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
            TFlags<ActorFlag4,_unsigned_int>::operator|=(&(this->super_AActor).flags4,&local_74);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void BeginPlay()
	{
		DDropItem *di;   // di will be our drop item list iterator
		DDropItem *drop; // while drop stays as the reference point.
		int n = 0;
		bool nomonsters = (dmflags & DF_NO_MONSTERS) || (level.flags2 & LEVEL2_NOMONSTERS);

		Super::BeginPlay();
		drop = di = GetDropItems();
		if (di != NULL)
		{
			while (di != NULL)
			{
				if (di->Name != NAME_None)
				{
					if (!nomonsters || !IsMonster(di))
					{
						if (di->Amount < 0) di->Amount = 1; // default value is -1, we need a positive value.
						n += di->Amount; // this is how we can weight the list.
					}
					di = di->Next;
				}
			}
			if (n == 0)
			{ // Nothing left to spawn. They must have all been monsters, and monsters are disabled.
				Destroy();
				return;
			}
			// Then we reset the iterator to the start position...
			di = drop;
			// Take a random number...
			n = pr_randomspawn(n);
			// And iterate in the array up to the random number chosen.
			while (n > -1 && di != NULL)
			{
				if (di->Name != NAME_None &&
					(!nomonsters || !IsMonster(di)))
				{
					n -= di->Amount;
					if ((di->Next != NULL) && (n > -1))
						di = di->Next;
					else
						n = -1;
				}
				else
				{
					di = di->Next;
				}
			}
			// So now we can spawn the dropped item.
			if (di == NULL || bouncecount >= MAX_RANDOMSPAWNERS_RECURSION)	// Prevents infinite recursions
			{
				Spawn("Unknown", Pos(), NO_REPLACE);		// Show that there's a problem.
				Destroy();
				return;
			}
			else if (pr_randomspawn() <= di->Probability)	// prob 255 = always spawn, prob 0 = almost never spawn.
			{
				// Handle replacement here so as to get the proper speed and flags for missiles
				PClassActor *cls;
				cls = PClass::FindActor(di->Name);
				if (cls != NULL)
				{
					PClassActor *rep = cls->GetReplacement();
					if (rep != NULL)
					{
						cls = rep;
					}
				}
				if (cls != NULL)
				{
					Species = cls->TypeName;
					AActor *defmobj = GetDefaultByType(cls);
					this->Speed = defmobj->Speed;
					this->flags  |= (defmobj->flags  & MF_MISSILE);
					this->flags2 |= (defmobj->flags2 & MF2_SEEKERMISSILE);
					this->flags4 |= (defmobj->flags4 & MF4_SPECTRAL);
				}
				else
				{
					Printf(TEXTCOLOR_RED "Unknown item class %s to drop from a random spawner\n", di->Name.GetChars());
					Species = NAME_None;
				}
			}
		}
	}